

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

int __thiscall mpt::source<double>::advance(source<double> *this)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar1 = this->_pos;
  iVar2 = -0x10;
  if ((-1 < lVar1) && (uVar4 = (this->super_span<const_double>)._len >> 3, lVar1 < (long)uVar4)) {
    uVar3 = lVar1 + this->_step;
    this->_pos = uVar3;
    iVar2 = 0;
    if (uVar3 < uVar4) {
      iVar2 = 0x19;
      if (this->_type != 0) {
        iVar2 = this->_type;
      }
    }
  }
  return iVar2;
}

Assistant:

int advance() __MPT_OVERRIDE
	{
		if (_pos < 0 || _pos >= span<const T>::size()) {
			return MissingData;
		}
		_pos += _step;
		if (_pos < 0 || _pos >= span<const T>::size()) {
			return 0;
		}
		return _type ? _type : type_properties<struct value>::id(true);
	}